

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstCastTestT<char>(void)

{
  if (ConstCastTestT<char>()::b == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::w == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::c == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::sc == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::uc == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::s == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::us == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::i == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::ui == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::l == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::ul == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::ll == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::ull == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::st == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::pt == '\0') {
    ConstCastTestT<char>();
  }
  if (ConstCastTestT<char>()::pl == '\0') {
    ConstCastTestT<char>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}